

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::SetCurrentLinkType(cmComputeLinkInformation *this,LinkType lt)

{
  Item local_88;
  Item local_48;
  LinkType local_14;
  cmComputeLinkInformation *pcStack_10;
  LinkType lt_local;
  cmComputeLinkInformation *this_local;
  
  if ((this->CurrentLinkType != lt) &&
     (this->CurrentLinkType = lt, (this->LinkTypeEnabled & 1U) != 0)) {
    local_14 = lt;
    pcStack_10 = this;
    if (this->CurrentLinkType == LinkStatic) {
      Item::Item(&local_48,&this->StaticLinkTypeFlag,false,(cmGeneratorTarget *)0x0);
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      push_back(&this->Items,&local_48);
      Item::~Item(&local_48);
    }
    else if (this->CurrentLinkType == LinkShared) {
      Item::Item(&local_88,&this->SharedLinkTypeFlag,false,(cmGeneratorTarget *)0x0);
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      push_back(&this->Items,&local_88);
      Item::~Item(&local_88);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::SetCurrentLinkType(LinkType lt)
{
  // If we are changing the current link type add the flag to tell the
  // linker about it.
  if (this->CurrentLinkType != lt) {
    this->CurrentLinkType = lt;

    if (this->LinkTypeEnabled) {
      switch (this->CurrentLinkType) {
        case LinkStatic:
          this->Items.push_back(Item(this->StaticLinkTypeFlag, false));
          break;
        case LinkShared:
          this->Items.push_back(Item(this->SharedLinkTypeFlag, false));
          break;
        default:
          break;
      }
    }
  }
}